

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

value * __thiscall cppcms::json::value::operator[](value *this,string *name)

{
  _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
  *this_00;
  const_iterator cVar1;
  bad_value_cast *pbVar2;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((((this->d).d.ptr_)->value_).type != is_object) {
    pbVar2 = (bad_value_cast *)__cxa_allocate_exception(0x48);
    std::__cxx11::string::string((string *)local_78,"",(allocator *)&local_48);
    bad_value_cast::bad_value_cast
              (pbVar2,(string *)local_78,(((this->d).d.ptr_)->value_).type,is_object);
    __cxa_throw(pbVar2,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
  }
  this_00 = &object(this)->_M_t;
  local_78._0_8_ = (name->_M_dataplus)._M_p;
  local_78._8_8_ = local_78._0_8_ + name->_M_string_length;
  local_68._M_allocated_capacity = (size_type)&local_58;
  local_68._8_8_ = 0;
  local_58._M_local_buf[0] = '\0';
  cVar1 = std::
          _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
          ::find(this_00,(key_type *)local_78);
  std::__cxx11::string::~string((string *)(local_78 + 0x10));
  if ((_Rb_tree_header *)cVar1._M_node != &(this_00->_M_impl).super__Rb_tree_header) {
    return (value *)&cVar1._M_node[2]._M_left;
  }
  pbVar2 = (bad_value_cast *)__cxa_allocate_exception(0x48);
  std::operator+(&local_48,"Member ",name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 &local_48," not found");
  bad_value_cast::bad_value_cast(pbVar2,(string *)local_78);
  __cxa_throw(pbVar2,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
}

Assistant:

value const &value::operator[](std::string const &name) const
	{
		if(type()!=json::is_object)
			throw bad_value_cast("",type(),json::is_object);
		json::object const &self=object();
		json::object::const_iterator p=self.find(string_key::unowned(name));
		if(p==self.end())
			throw bad_value_cast("Member "+name+" not found");
		return p->second;
	}